

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::ban_ip(session_impl *this,address *addr)

{
  shared_ptr<libtorrent::ip_filter> *this_00;
  pointer psVar1;
  torrent *this_01;
  element_type *this_02;
  pointer psVar2;
  __shared_ptr<libtorrent::ip_filter_const,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = &this->m_ip_filter;
  this_02 = (this->m_ip_filter).
            super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_02 == (element_type *)0x0) {
    ::std::make_shared<libtorrent::ip_filter>();
    ::std::__shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>,
               &local_40);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    this_02 = (this_00->super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  }
  ip_filter::add_rule(this_02,addr,addr,1);
  psVar1 = (this->m_torrents).m_array.
           super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->m_torrents).m_array.
                super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    this_01 = (psVar2->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    ::std::__shared_ptr<libtorrent::ip_filter_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::ip_filter,void>
              (local_50,&this_00->
                         super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>);
    torrent::set_ip_filter(this_01,(shared_ptr<const_libtorrent::ip_filter> *)local_50);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  return;
}

Assistant:

void session_impl::ban_ip(address addr)
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_ip_filter) m_ip_filter = std::make_shared<ip_filter>();
		m_ip_filter->add_rule(addr, addr, ip_filter::blocked);
		for (auto& i : m_torrents)
			i->set_ip_filter(m_ip_filter);
	}